

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::HistogramTest_observe_multiple_test_total_sum_Test::TestBody
          (HistogramTest_observe_multiple_test_total_sum_Test *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  char *pcVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  Histogram h;
  ClientMetric metric;
  Histogram histogram;
  Message local_148;
  AssertHelper local_140;
  allocator_type local_138 [8];
  undefined8 *local_130;
  double local_128;
  double dStack_120;
  vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  local_118;
  ClientMetric local_f8;
  Histogram local_68;
  
  local_128 = 1.0;
  dStack_120 = 2.0;
  __l._M_len = 2;
  __l._M_array = &local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_f8,__l,local_138);
  Histogram::Histogram(&local_68,(BucketBoundaries *)&local_f8);
  if (local_f8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128 = 5.0;
  dStack_120 = 9.0;
  local_118.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = &local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_f8,__l_00,local_138);
  Histogram::ObserveMultiple(&local_68,(vector<double,_std::allocator<double>_> *)&local_f8,20.0);
  if (local_f8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128 = 0.0;
  dStack_120 = 20.0;
  local_118.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4018000000000000;
  __l_01._M_len = 3;
  __l_01._M_array = &local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_f8,__l_01,local_138);
  Histogram::ObserveMultiple(&local_68,(vector<double,_std::allocator<double>_> *)&local_f8,34.0);
  if (local_f8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Histogram::Collect(&local_f8,&local_68);
  local_128 = (double)local_f8.histogram.sample_count;
  dStack_120 = local_f8.histogram.sample_sum;
  std::vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>::
  vector(&local_118,&local_f8.histogram.bucket);
  local_148.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x2b;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_138,"h.sample_count","43U",(unsigned_long *)&local_128,
             (uint *)&local_148);
  if (local_138[0] == (allocator_type)0x0) {
    testing::Message::Message(&local_148);
    if (local_130 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_130;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT44(local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_148.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_148.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = local_130;
  if (local_130 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_130 != local_130 + 2) {
      operator_delete((undefined8 *)*local_130);
    }
    operator_delete(puVar1);
  }
  local_148.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x36;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)local_138,"h.sample_sum","54",&dStack_120,(int *)&local_148);
  if (local_138[0] == (allocator_type)0x0) {
    testing::Message::Message(&local_148);
    if (local_130 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_130;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((long *)CONCAT44(local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_148.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_148.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_130 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_130 != local_130 + 2) {
      operator_delete((undefined8 *)*local_130);
    }
    operator_delete(local_130);
  }
  if (local_118.
      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.histogram.bucket.
      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.histogram.bucket.
                    super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.summary.quantile.
      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.summary.quantile.
                    super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&local_f8.label);
  if (local_68.bucket_counts_.
      super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.bucket_counts_.
                    super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.bucket_boundaries_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.bucket_boundaries_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HistogramTest, observe_multiple_test_total_sum) {
  Histogram histogram{{1, 2}};
  histogram.ObserveMultiple({5, 9, 3}, 20);
  histogram.ObserveMultiple({0, 20, 6}, 34);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_count, 43U);
  EXPECT_EQ(h.sample_sum, 54);
}